

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  bool bVar4;
  Limit limit;
  int iVar5;
  uint32 first_byte_or_zero;
  int64 iVar6;
  ulong uVar7;
  uint first_byte_or_zero_00;
  int value;
  ulong unaff_R12;
  bool bVar8;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    first_byte_or_zero_00 = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      input->buffer_ = pbVar2 + 1;
      bVar8 = true;
      goto LAB_00334784;
    }
  }
  else {
    first_byte_or_zero_00 = 0;
  }
  iVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero_00);
  first_byte_or_zero_00 = (uint)iVar6;
  bVar8 = -1 < iVar6;
LAB_00334784:
  if (bVar8) {
    limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero_00);
    do {
      iVar5 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar5 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar7 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003347c3;
        input->buffer_ = pbVar2 + 1;
        bVar8 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_003347c3:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar8 = -1 < (long)uVar7;
      }
      uVar3 = unaff_R12;
      if (bVar8) {
        uVar3 = uVar7;
      }
      unaff_R12 = uVar3 & 0xffffffff;
      if (!bVar8) {
        return false;
      }
      if ((is_valid == (_func_bool_int *)0x0) || (bVar4 = (*is_valid)((int)uVar3), bVar4)) {
        if (values->current_size_ == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        iVar5 = values->current_size_;
        values->current_size_ = iVar5 + 1;
        values->rep_->elements[iVar5] = (int)uVar3;
      }
    } while (bVar8);
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}